

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_pattern.cpp
# Opt level: O1

void __thiscall duckdb::FilenamePattern::SetFilenamePattern(FilenamePattern *this,string *pattern)

{
  pointer pcVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  string uuid_format;
  string id_format;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"{i}","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"{uuid}","");
  ::std::__cxx11::string::_M_assign((string *)this);
  iVar3 = ::std::__cxx11::string::find((char *)this,(ulong)local_b0._M_dataplus._M_p,0);
  this->pos = iVar3;
  this->uuid = false;
  if (iVar3 != 0xffffffffffffffff) {
    pcVar1 = (this->base)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (this->base)._M_string_length);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,anon_var_dwarf_4f001a4 + 9);
    StringUtil::Replace(&local_90,&local_50,&local_b0,&local_f0);
    ::std::__cxx11::string::operator=((string *)this,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    this->uuid = false;
  }
  iVar3 = ::std::__cxx11::string::find((char *)this,(ulong)local_d0._M_dataplus._M_p,0);
  this->pos = iVar3;
  if (iVar3 != 0xffffffffffffffff) {
    pcVar1 = (this->base)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (this->base)._M_string_length);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,anon_var_dwarf_4f001a4 + 9);
    StringUtil::Replace(&local_90,&local_70,&local_d0,&local_f0);
    ::std::__cxx11::string::operator=((string *)this,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    this->uuid = true;
  }
  uVar2 = (this->base)._M_string_length;
  uVar4 = this->pos;
  if (uVar2 < this->pos) {
    uVar4 = uVar2;
  }
  this->pos = uVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FilenamePattern::SetFilenamePattern(const string &pattern) {
	const string id_format {"{i}"};
	const string uuid_format {"{uuid}"};

	base = pattern;

	pos = base.find(id_format);
	uuid = false;
	if (pos != string::npos) {
		base = StringUtil::Replace(base, id_format, "");
		uuid = false;
	}

	pos = base.find(uuid_format);
	if (pos != string::npos) {
		base = StringUtil::Replace(base, uuid_format, "");
		uuid = true;
	}

	pos = std::min(pos, (idx_t)base.length());
}